

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fgetpos.c
# Opt level: O3

int fgetpos(FILE *__stream,fpos_t *__pos)

{
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  __pos->__pos = (long)__stream->_IO_write_ptr -
                 (long)(__stream->_IO_buf_base +
                       (*(int *)&__stream->_IO_write_base - *(int *)&__stream->_IO_read_base));
  (__pos->__state).__count = *(int *)&__stream->_IO_write_end;
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return 0;
}

Assistant:

int fgetpos( struct _PDCLIB_file_t * _PDCLIB_restrict stream, struct _PDCLIB_fpos_t * _PDCLIB_restrict pos )
{
    _PDCLIB_LOCK( stream->mtx );
    pos->offset = ( stream->pos.offset - ( ( ( int )stream->bufend - ( int )stream->bufidx ) + stream->ungetidx ) );
    pos->status = stream->pos.status;
    /* TODO: Add mbstate. */
    _PDCLIB_UNLOCK( stream->mtx );
    return 0;
}